

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

PosixZone * __thiscall
anon_unknown.dwarf_13b371b::PosixZone::parse
          (PosixZone *__return_storage_ptr__,PosixZone *this,char **pos,char *end)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  Data *end_00;
  long lVar8;
  Data *pDVar9;
  Data *pDVar10;
  undefined1 *puVar11;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  QString local_58;
  PosixZone *local_38;
  
  local_38 = *(PosixZone **)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->name).d.d;
  if (*(char *)&(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> == '<') {
    pDVar5 = (Data *)((long)&(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    pDVar10 = pDVar5;
    pDVar9 = pDVar5;
    if (pDVar5 < pos) {
      do {
        pDVar10 = pDVar9;
        if (*(char *)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> == '>')
        break;
        pDVar9 = (Data *)((long)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> +
                         1);
        pDVar10 = (Data *)pos;
      } while (pDVar9 != (Data *)pos);
    }
    pDVar9 = (Data *)((long)&(pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
    ;
  }
  else {
    pDVar9 = pDVar5;
    pDVar7 = pDVar5;
    pDVar10 = pDVar5;
    if (pDVar5 < pos) {
      do {
        pDVar9 = pDVar7;
        pDVar10 = pDVar7;
        if (0x19 < (byte)((*(byte *)&(pDVar7->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int> | 0x20) + 0x9f)) break;
        pDVar7 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> +
                         1);
        pDVar9 = (Data *)pos;
        pDVar10 = (Data *)pos;
      } while (pDVar7 != (Data *)pos);
    }
  }
  (this->name).d.d = pDVar9;
  if ((long)pDVar10 - (long)pDVar5 < 3) {
    (__return_storage_ptr__->name).d.d = (Data *)0x0;
    (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->name).d.size = 0;
    __return_storage_ptr__->offset = -0x80000000;
    goto LAB_003ff5f1;
  }
  pDVar7 = pDVar9;
  if ((pDVar9 < pos) &&
     ((cVar1 = *(char *)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>,
      cVar1 == '-' || (cVar1 == '+')))) {
    pDVar7 = (Data *)((long)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
  }
  end_00 = pDVar7;
  if (pDVar7 < pos) {
    lVar8 = (long)pos - (long)pDVar7;
    do {
      pvVar4 = memchr("0123456789:",
                      (int)*(char *)&(pDVar7->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int>,0xc);
      end_00 = pDVar7;
      if (pvVar4 == (void *)0x0) break;
      pDVar7 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
                       );
      lVar8 = lVar8 + -1;
      end_00 = (Data *)pos;
    } while (lVar8 != 0);
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ba.m_data = end;
  ba.m_size = (qsizetype)pDVar5;
  QString::fromUtf8(&local_58,(QString *)((long)pDVar10 - (long)pDVar5),ba);
  if (pDVar9 < end_00) {
    cVar1 = *(char *)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>;
    if (cVar1 == '-') {
      iVar3 = parsePosixTime((char *)((long)&(pDVar9->super_QArrayData).ref_._q_value.
                                             super___atomic_base<int> + 1),(char *)end_00);
    }
    else {
      if (cVar1 == '+') {
        pDVar9 = (Data *)((long)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> +
                         1);
      }
      iVar3 = parsePosixTime((char *)pDVar9,(char *)end_00);
      iVar3 = -iVar3;
    }
    (this->name).d.d = end_00;
    if (iVar3 != 0) goto LAB_003ff528;
    iVar3 = 0;
    pcVar6 = local_58.d.ptr;
    puVar11 = (undefined1 *)local_58.d.size;
  }
  else {
    (this->name).d.d = end_00;
    iVar3 = -0x80000000;
LAB_003ff528:
    pcVar6 = local_58.d.ptr;
    puVar11 = (undefined1 *)local_58.d.size;
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x3) {
      rhs.m_data = "UTC";
      rhs.m_size = 3;
      lhs.m_data = local_58.d.ptr;
      lhs.m_size = 3;
      bVar2 = QtPrivate::equalStrings(lhs,rhs);
      if ((bVar2) ||
         (rhs_00.m_data = "GMT", rhs_00.m_size = 3, lhs_00.m_data = pcVar6, lhs_00.m_size = 3,
         bVar2 = QtPrivate::equalStrings(lhs_00,rhs_00), puVar11 = (undefined1 *)0x3, bVar2)) {
        (__return_storage_ptr__->name).d.d = (Data *)0x0;
        (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->name).d.size = 0;
        __return_storage_ptr__->offset = -0x80000000;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_003ff5f1;
      }
    }
  }
  (__return_storage_ptr__->name).d.d = local_58.d.d;
  (__return_storage_ptr__->name).d.ptr = pcVar6;
  (__return_storage_ptr__->name).d.size = (qsizetype)puVar11;
  __return_storage_ptr__->offset = iVar3;
LAB_003ff5f1:
  if (*(PosixZone **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(PosixZone **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

PosixZone PosixZone::parse(const char *&pos, const char *end)
{
    static const char offsetChars[] = "0123456789:";

    const char *nameBegin = pos;
    const char *nameEnd;
    Q_ASSERT(pos < end);

    if (*pos == '<') {
        ++nameBegin;    // skip the '<'
        nameEnd = nameBegin;
        while (nameEnd < end && *nameEnd != '>') {
            // POSIX says only alphanumeric, but we allow anything
            ++nameEnd;
        }
        pos = nameEnd + 1;      // skip the '>'
    } else {
        nameEnd = nameBegin;
        while (nameEnd < end && asciiIsLetter(*nameEnd))
            ++nameEnd;
        pos = nameEnd;
    }
    if (nameEnd - nameBegin < 3)
        return {};  // name must be at least 3 characters long

    // zone offset, form [+-]hh:mm:ss
    const char *zoneBegin = pos;
    const char *zoneEnd = pos;
    if (zoneEnd < end && (zoneEnd[0] == '+' || zoneEnd[0] == '-'))
        ++zoneEnd;
    while (zoneEnd < end) {
        if (strchr(offsetChars, char(*zoneEnd)) == nullptr)
            break;
        ++zoneEnd;
    }

    QString name = QString::fromUtf8(nameBegin, nameEnd - nameBegin);
    const int offset = zoneEnd > zoneBegin ? parsePosixOffset(zoneBegin, zoneEnd) : InvalidOffset;
    pos = zoneEnd;
    // UTC+hh:mm:ss or GMT+hh:mm:ss should be read as offsets from UTC, not as a
    // POSIX rule naming a zone as UTC or GMT and specifying a non-zero offset.
    if (offset != 0 && (name =="UTC"_L1 || name == "GMT"_L1))
        return {};
    return {std::move(name), offset};
}